

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

QRect __thiscall
QStyle::itemTextRect
          (QStyle *this,QFontMetrics *metrics,QRect *rect,int alignment,bool enabled,QString *text)

{
  uint x;
  uint y;
  uint uVar1;
  QRect QVar2;
  int iVar3;
  QStyle *this_00;
  QStyle *pQVar4;
  ulong uVar5;
  ulong uVar6;
  QRect QVar7;
  
  x = (rect->x1).m_i;
  QVar2.y1.m_i = 0;
  QVar2.x1.m_i = x;
  y = (rect->y1).m_i;
  uVar5 = (ulong)y;
  iVar3 = (rect->x2).m_i;
  QVar2.x2.m_i = iVar3;
  QVar2.y2.m_i = 0;
  uVar1 = (rect->y2).m_i;
  uVar6 = (ulong)uVar1;
  if ((text->d).size != 0) {
    QVar7 = QFontMetrics::boundingRect
                      (metrics,x,y,(iVar3 - x) + 1,(uVar1 - y) + 1,alignment,text,0,(int *)0x0);
    this_00 = QVar7._0_8_;
    uVar5 = (ulong)this_00 >> 0x20;
    uVar6 = QVar7._8_8_ >> 0x20;
    QVar2 = QVar7;
    if (!enabled) {
      pQVar4 = proxy(this_00);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0,0,0,0);
      if (iVar3 != 0) {
        QVar2.x2.m_i = QVar7.x2.m_i.m_i + 1;
        QVar2._0_8_ = (ulong)this_00;
        QVar2.y2.m_i = 0;
        uVar6 = (ulong)(QVar7.y2.m_i.m_i + 1);
      }
    }
  }
  QVar7._0_8_ = QVar2._0_8_ & 0xffffffff | uVar5 << 0x20;
  QVar7._8_8_ = QVar2._8_8_ & 0xffffffff | uVar6 << 0x20;
  return QVar7;
}

Assistant:

QRect QStyle::itemTextRect(const QFontMetrics &metrics, const QRect &rect, int alignment, bool enabled,
                       const QString &text) const
{
    QRect result;
    int x, y, w, h;
    rect.getRect(&x, &y, &w, &h);
    if (!text.isEmpty()) {
        result = metrics.boundingRect(x, y, w, h, alignment, text);
        if (!enabled && proxy()->styleHint(SH_EtchDisabledText)) {
            result.setWidth(result.width()+1);
            result.setHeight(result.height()+1);
        }
    } else {
        result = QRect(x, y, w, h);
    }
    return result;
}